

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_api.cc
# Opt level: O2

int XLearnGetPreModel(XL *out,string *pre_model_path)

{
  std::__cxx11::string::_M_assign((string *)pre_model_path);
  return 0;
}

Assistant:

XL_DLL int XLearnGetPreModel(XL* out, std::string& pre_model_path) {
  API_BEGIN();
  XLearn* xl = reinterpret_cast<XLearn*>(*out);
  pre_model_path = xl->GetHyperParam().pre_model_file;
  API_END();
}